

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeGetAttrValue(xmlNode *node,xmlChar *name,xmlChar *nsUri,xmlChar **out)

{
  xmlAttrPtr prop;
  xmlChar *pxVar1;
  int iVar2;
  
  iVar2 = 1;
  if (out != (xmlChar **)0x0) {
    *out = (xmlChar *)0x0;
    prop = xmlGetPropNodeInternal(node,name,nsUri,0);
    if (prop != (xmlAttrPtr)0x0) {
      pxVar1 = xmlGetPropNodeValueInternal(prop);
      *out = pxVar1;
      iVar2 = -(uint)(pxVar1 == (xmlChar *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int
xmlNodeGetAttrValue(const xmlNode *node, const xmlChar *name,
                    const xmlChar *nsUri, xmlChar **out) {
    xmlAttrPtr prop;

    if (out == NULL)
        return(1);
    *out = NULL;

    prop = xmlGetPropNodeInternal(node, name, nsUri, 0);
    if (prop == NULL)
	return(1);

    *out = xmlGetPropNodeValueInternal(prop);
    if (*out == NULL)
        return(-1);
    return(0);
}